

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O2

void __thiscall
TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_>::ComputeV2
          (TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_> *this,TPZFMatrix<double> *x,
          TPZFMatrix<double> *v2)

{
  _List_node_base *p_Var1;
  int isub;
  TPZFNMatrix<100,_double> v2_local;
  TPZFNMatrix<100,_double> Residual_local;
  TPZFNMatrix<100,_double> local_7a0;
  TPZFNMatrix<100,_double> local_3e8;
  
  isub = 0;
  p_Var1 = (_List_node_base *)&this->fGlobal;
  while (p_Var1 = (((_List_base<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this->fGlobal) {
    TPZFNMatrix<100,_double>::TPZFNMatrix(&local_3e8);
    TPZFNMatrix<100,_double>::TPZFNMatrix(&local_7a0);
    TPZDohrAssembly<double>::Extract
              (((this->fAssemble).fRef)->fPointer,isub,x,&local_3e8.super_TPZFMatrix<double>);
    TPZDohrSubstructCondense<double>::Contribute_v2_local
              (*(TPZDohrSubstructCondense<double> **)p_Var1[1]._M_next,
               &local_3e8.super_TPZFMatrix<double>,&local_7a0.super_TPZFMatrix<double>);
    TPZDohrAssembly<double>::Assemble
              (((this->fAssemble).fRef)->fPointer,isub,&local_7a0.super_TPZFMatrix<double>,v2);
    TPZFNMatrix<100,_double>::~TPZFNMatrix(&local_7a0);
    TPZFNMatrix<100,_double>::~TPZFNMatrix(&local_3e8);
    isub = isub + 1;
  }
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::ComputeV2(const TPZFMatrix<TVar> &x, TPZFMatrix<TVar> &v2) const
{
	
	typename std::list<TPZAutoPointer<TSubStruct> >::const_iterator it;
	
	int isub=0;
	//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
	for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
	{
		// contribute v2 deve ser uma tarefa inicializada mais cedo
		TPZFNMatrix<100,TVar> Residual_local,v2_local;
		fAssemble->Extract(isub,x,Residual_local);
		(*it)->Contribute_v2_local(Residual_local,v2_local);
#ifdef PZ_LOG
		{
			std::stringstream sout;
			sout << "Substructure " << isub << std::endl;
			Residual_local.Print("Residual local",sout);
            v2_local.Print("v2_local",sout);
			if (logger.isDebugEnabled())
			{
				LOGPZ_DEBUG(logger, sout.str());
			}
		}
#endif
		//		v2_local += v1_local;
		fAssemble->Assemble(isub,v2_local,v2);
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		v2.Print("v2 vector",sout);
		if (loggerv1v2.isDebugEnabled())
		{
			LOGPZ_DEBUG(loggerv1v2, sout.str())
		}
	}
#endif
}